

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

bool_t strIsPrintable(char *str)

{
  byte bVar1;
  void *pvVar2;
  
  while( true ) {
    bVar1 = *str;
    if (bVar1 == 0) {
      return 1;
    }
    if ((((byte)(bVar1 - 0x3a) < 0xf6) && ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) &&
       (pvVar2 = memchr(" \'()+,-./:=?",(int)(char)bVar1,0xd), pvVar2 == (void *)0x0)) break;
    str = (char *)((byte *)str + 1);
  }
  return 0;
}

Assistant:

bool_t strIsPrintable(const char* str)
{
	ASSERT(strIsValid(str));
	for (; *str; ++str)
		if ((*str < '0' || *str > '9') &&
			(*str < 'A' || *str > 'Z') &&
			(*str < 'a' || *str > 'z') &&
			strchr(" '()+,-./:=?", *str) == 0)
			return FALSE;
	return TRUE;
}